

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

bool __thiscall
ON_DimStyle::Internal_SetIdMember
          (ON_DimStyle *this,field field_id,ON_UUID value,ON_UUID *class_member)

{
  undefined8 uVar1;
  bool bVar2;
  ON_UUID_struct local_30;
  
  local_30.Data4 = value.Data4;
  local_30._0_8_ = value._0_8_;
  bVar2 = ::operator!=(&local_30,class_member);
  if (bVar2) {
    class_member->Data1 = local_30.Data1;
    class_member->Data2 = local_30.Data2;
    class_member->Data3 = local_30.Data3;
    *&class_member->Data4 = local_30.Data4;
    ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    uVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    *(undefined8 *)(this->m_content_hash).m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar1;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  return bVar2;
}

Assistant:

bool ON_DimStyle::Internal_SetIdMember(
  ON_DimStyle::field field_id,
  ON_UUID value,
  ON_UUID& class_member
)
{
  bool bValueChanged = false;
  if (value != class_member)
  {
    class_member = value;
    Internal_ContentChange();
    bValueChanged = true;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  return bValueChanged;
}